

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamEuler::ShapeFunctions(ChElementBeamEuler *this,ShapeVector *N,double eta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar8 [64];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = eta;
  dVar3 = 1.0 - eta;
  dVar2 = eta + 1.0;
  dVar1 = (this->super_ChElementBeam).length;
  dVar9 = 1.0 / (dVar1 + dVar1);
  auVar7 = auVar8._0_16_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = eta * 3.0;
  auVar4 = vfmadd231sd_fma(ZEXT816(0xc008000000000000),auVar10,auVar7);
  auVar6 = vfnmadd231sd_fma(ZEXT816(0x4008000000000000),auVar10,auVar7);
  auVar10 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar7,ZEXT816(0xc000000000000000));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = eta * 3.0;
  auVar5 = vfmadd231sd_fma(auVar10,auVar11,auVar7);
  auVar10 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar7,ZEXT816(0x3ff0000000000000));
  auVar10 = vfnmadd231sd_fma(auVar10,auVar11,auVar7);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[0] =
       dVar3 * 0.5;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[1] =
       (eta + 2.0) * dVar3 * dVar3 * 0.25;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[2] =
       dVar2 * dVar1 * 0.125 * dVar3 * dVar3;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[3] =
       dVar2 * 0.5;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[4] =
       (2.0 - eta) * dVar2 * dVar2 * 0.25;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[5] =
       (eta + -1.0) * dVar2 * dVar2 * dVar1 * 0.125;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[6] =
       auVar4._0_8_ * dVar9;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[7] =
       auVar6._0_8_ * dVar9;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[8] =
       auVar5._0_8_ * 0.25;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[9] =
       auVar10._0_8_ * -0.25;
  return;
}

Assistant:

void ChElementBeamEuler::ShapeFunctions(ShapeVector& N, double eta) {
    double Nx1 = (1. / 2.) * (1 - eta);
    double Nx2 = (1. / 2.) * (1 + eta);
    double Ny1 = (1. / 4.) * pow((1 - eta), 2) * (2 + eta);
    double Ny2 = (1. / 4.) * pow((1 + eta), 2) * (2 - eta);
    double Nr1 = (this->length / 8.) * pow((1 - eta), 2) * (1 + eta);
    double Nr2 = (this->length / 8.) * pow((1 + eta), 2) * (eta - 1);
    /*
    N(0) = Nx1;
    N(1) = Ny1;
    N(2) = Ny1;
    N(3) = Nx1;
    N(4) = -Nr1;
    N(5) = Nr1;
    N(6) = Nx2;
    N(7) = Ny2;
    N(8) = Ny2;
    N(9) = Nx2;
    N(10) = -Nr2;
    N(11) = Nr2;
    */
    double dN_ua = (1. / (2. * this->length)) * (-3. + 3 * eta * eta);
    double dN_ub = (1. / (2. * this->length)) * (3. - 3 * eta * eta);
    double dN_ra = (1. / 4.) * (-1. - 2 * eta + 3 * eta * eta);
    double dN_rb = -(1. / 4.) * (1. - 2 * eta - 3 * eta * eta);
    N(0) = Nx1;
    N(1) = Ny1;
    N(2) = Nr1;
    N(3) = Nx2;
    N(4) = Ny2;
    N(5) = Nr2;
    N(6) = dN_ua;
    N(7) = dN_ub;
    N(8) = dN_ra;
    N(9) = dN_rb;
}